

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_resilience_test.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_39a821::ErrorResilienceTestLarge::DoDecode(ErrorResilienceTestLarge *this)

{
  ostream *poVar1;
  long in_RDI;
  uint i;
  uint local_14;
  
  if ((*(int *)(in_RDI + 0x408) != 0) &&
     ((*(int *)(in_RDI + 100) == 2 || (*(int *)(in_RDI + 100) == 0)))) {
    for (local_14 = 0; local_14 < *(uint *)(in_RDI + 0x408); local_14 = local_14 + 1) {
      if (*(int *)(in_RDI + 0x434 + (ulong)local_14 * 4) == *(int *)(in_RDI + 0x400) + -1) {
        poVar1 = std::operator<<((ostream *)&std::cout,"             Skipping decoding frame: ");
        poVar1 = (ostream *)
                 std::ostream::operator<<(poVar1,*(uint *)(in_RDI + 0x434 + (ulong)local_14 * 4));
        std::operator<<(poVar1,"\n");
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool DoDecode() const override {
    if (error_nframes_ > 0 &&
        (cfg_.g_pass == AOM_RC_LAST_PASS || cfg_.g_pass == AOM_RC_ONE_PASS)) {
      for (unsigned int i = 0; i < error_nframes_; ++i) {
        if (error_frames_[i] == nframes_ - 1) {
          std::cout << "             Skipping decoding frame: "
                    << error_frames_[i] << "\n";
          return false;
        }
      }
    }
    return true;
  }